

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O2

ProfileData *
anon_unknown.dwarf_3ea68::readProfile(ProfileData *__return_storage_ptr__,string *file)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined1 local_90 [8];
  anon_class_24_3_ef786fa9 readi32;
  vector<unsigned_long,_std::allocator<unsigned_long>_> timestamps;
  long local_58;
  vector<char,_std::allocator<char>_> profileData;
  size_t local_40;
  size_t i;
  
  wasm::read_file<std::vector<char,std::allocator<char>>>((string *)&local_58,(BinaryOption)file);
  local_90 = (undefined1  [8])&local_40;
  local_40 = 0;
  readi32.i = (size_t *)&local_58;
  readi32.profileData = (vector<char,_std::allocator<char>_> *)file;
  uVar1 = readProfile::anon_class_24_3_ef786fa9::operator()((anon_class_24_3_ef786fa9 *)local_90);
  uVar2 = readProfile::anon_class_24_3_ef786fa9::operator()((anon_class_24_3_ef786fa9 *)local_90);
  readi32.file = (string *)0x0;
  while (local_40 < (ulong)(_profileData - local_58)) {
    uVar3 = readProfile::anon_class_24_3_ef786fa9::operator()((anon_class_24_3_ef786fa9 *)local_90);
    i = (size_t)uVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&readi32.file,&i);
  }
  __return_storage_ptr__->hash = CONCAT44(uVar2,uVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->timestamps,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&readi32.file);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&readi32.file);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

ProfileData readProfile(const std::string& file) {
  auto profileData = read_file<std::vector<char>>(file, Flags::Binary);
  size_t i = 0;
  auto readi32 = [&]() {
    if (i + 4 > profileData.size()) {
      Fatal() << "Unexpected end of profile data in " << file;
    }
    uint32_t i32 = 0;
    i32 |= uint32_t(uint8_t(profileData[i++]));
    i32 |= uint32_t(uint8_t(profileData[i++])) << 8;
    i32 |= uint32_t(uint8_t(profileData[i++])) << 16;
    i32 |= uint32_t(uint8_t(profileData[i++])) << 24;
    return i32;
  };

  uint64_t hash = readi32();
  hash |= uint64_t(readi32()) << 32;

  std::vector<size_t> timestamps;
  while (i < profileData.size()) {
    timestamps.push_back(readi32());
  }

  return {hash, timestamps};
}